

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_2fe304::BuildFileImpl::parseToolsMapping(BuildFileImpl *this,MappingNode *map)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  KeyValueNode *pKVar4;
  Node *pNVar5;
  ScalarNode *pSVar6;
  MappingNode *this_00;
  undefined8 uVar7;
  Tool *pTVar8;
  SequenceNode *this_01;
  ScalarNode *pSVar9;
  iterator __first;
  iterator __last;
  char cVar10;
  string local_4f0;
  undefined8 local_4d0;
  undefined8 local_4c0;
  undefined8 local_4b8;
  ConfigureContext local_4b0;
  StringRef local_488;
  allocator<llvm::StringRef> local_471;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_470;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_468;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_460;
  ArrayRef<llvm::StringRef> local_448;
  undefined8 local_438;
  undefined8 local_430;
  ConfigureContext local_428;
  string local_400;
  StringRef local_3e0;
  ScalarNode *local_3d0;
  Node *node;
  iterator __end6;
  iterator __begin6;
  SequenceNode *__range6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values_1;
  vector<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
  local_380;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined8 local_350;
  ConfigureContext local_348;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  undefined1 local_2e0 [8];
  string value_1;
  string key_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  StringRef local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  StringRef local_210;
  KeyValueNode *local_200;
  KeyValueNode *entry_1;
  iterator __end5;
  iterator __begin5;
  MappingNode *__range5;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  values;
  string attribute;
  Node *value;
  Node *key;
  KeyValueNode *valueEntry;
  iterator __end3;
  iterator __begin3;
  MappingNode *__range3;
  StringRef local_160;
  Tool *tool;
  MappingNode *attrs;
  string name;
  StringRef local_110;
  KeyValueNode *entry;
  iterator __end2;
  iterator __begin2;
  MappingNode *__range2;
  MappingNode *map_local;
  BuildFileImpl *this_local;
  
  __end2 = llvm::yaml::MappingNode::begin(map);
  entry = (KeyValueNode *)llvm::yaml::MappingNode::end(map);
  while (bVar1 = llvm::yaml::
                 basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                 operator!=(&__end2,(basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                     *)&entry), bVar1) {
    pKVar4 = llvm::yaml::
             basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::operator*
                       (&__end2);
    pNVar5 = llvm::yaml::KeyValueNode::getKey(pKVar4);
    uVar2 = llvm::yaml::Node::getType(pNVar5);
    if (uVar2 == 1) {
      pNVar5 = llvm::yaml::KeyValueNode::getValue(pKVar4);
      uVar2 = llvm::yaml::Node::getType(pNVar5);
      if (uVar2 == 4) {
        pSVar6 = (ScalarNode *)llvm::yaml::KeyValueNode::getKey(pKVar4);
        (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                  ((string *)&attrs,this,pSVar6);
        this_00 = (MappingNode *)llvm::yaml::KeyValueNode::getValue(pKVar4);
        uVar7 = std::__cxx11::string::data();
        local_160.Data = (char *)uVar7;
        uVar7 = std::__cxx11::string::length();
        local_160.Length = uVar7;
        pNVar5 = llvm::yaml::KeyValueNode::getKey(pKVar4);
        pTVar8 = getOrCreateTool(this,local_160,pNVar5);
        if (pTVar8 == (Tool *)0x0) {
          this_local._7_1_ = 0;
          cVar10 = '\x01';
        }
        else {
          __end3 = llvm::yaml::MappingNode::begin(this_00);
          valueEntry = (KeyValueNode *)llvm::yaml::MappingNode::end(this_00);
          while (bVar1 = llvm::yaml::
                         basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                         ::operator!=(&__end3,(basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                               *)&valueEntry), bVar1) {
            pKVar4 = llvm::yaml::
                     basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                     operator*(&__end3);
            pSVar6 = (ScalarNode *)llvm::yaml::KeyValueNode::getKey(pKVar4);
            this_01 = (SequenceNode *)llvm::yaml::KeyValueNode::getValue(pKVar4);
            uVar2 = llvm::yaml::Node::getType((Node *)pSVar6);
            if (uVar2 == 1) {
              (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                        ((string *)
                         &values.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,this,pSVar6);
              uVar2 = llvm::yaml::Node::getType((Node *)this_01);
              if (uVar2 == 4) {
                std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&__range5);
                __end5 = llvm::yaml::MappingNode::begin((MappingNode *)this_01);
                entry_1 = (KeyValueNode *)llvm::yaml::MappingNode::end((MappingNode *)this_01);
                while (bVar1 = llvm::yaml::
                               basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                               ::operator!=(&__end5,(
                                                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                                  *)&entry_1), bVar1) {
                  local_200 = llvm::yaml::
                              basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                              ::operator*(&__end5);
                  pNVar5 = llvm::yaml::KeyValueNode::getKey(local_200);
                  uVar2 = llvm::yaml::Node::getType(pNVar5);
                  if (uVar2 == 1) {
                    pNVar5 = llvm::yaml::KeyValueNode::getValue(local_200);
                    uVar2 = llvm::yaml::Node::getType(pNVar5);
                    if (uVar2 == 1) {
                      pSVar9 = (ScalarNode *)llvm::yaml::KeyValueNode::getKey(local_200);
                      (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                ((string *)((long)&value_1.field_2 + 8),this,pSVar9);
                      pSVar9 = (ScalarNode *)llvm::yaml::KeyValueNode::getValue(local_200);
                      (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                ((string *)local_2e0,this,pSVar9);
                      std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
                                (&local_320,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)((long)&value_1.field_2 + 8),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2e0);
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&__range5,&local_320);
                      std::
                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~pair(&local_320);
                      std::__cxx11::string::~string((string *)local_2e0);
                      std::__cxx11::string::~string((string *)(value_1.field_2._M_local_buf + 8));
                    }
                    else {
                      pNVar5 = llvm::yaml::KeyValueNode::getKey(local_200);
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&key_1.field_2 + 8),"invalid value type for \'",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&values.
                                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      std::operator+(&local_280,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&key_1.field_2 + 8),"\' in \'tools\' map");
                      uVar7 = std::__cxx11::string::data();
                      local_260.Data = (char *)uVar7;
                      uVar7 = std::__cxx11::string::length();
                      local_260.Length = uVar7;
                      error(this,pNVar5,local_260);
                      std::__cxx11::string::~string((string *)&local_280);
                      std::__cxx11::string::~string((string *)(key_1.field_2._M_local_buf + 8));
                    }
                  }
                  else {
                    pNVar5 = llvm::yaml::KeyValueNode::getKey(local_200);
                    std::operator+(&local_250,"invalid key type for \'",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&values.
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    std::operator+(&local_230,&local_250,"\' in \'tools\' map");
                    uVar7 = std::__cxx11::string::data();
                    local_210.Data = (char *)uVar7;
                    uVar7 = std::__cxx11::string::length();
                    local_210.Length = uVar7;
                    error(this,pNVar5,local_210);
                    std::__cxx11::string::~string((string *)&local_230);
                    std::__cxx11::string::~string((string *)&local_250);
                  }
                  llvm::yaml::
                  basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
                  operator++(&__end5);
                }
                getContext(&local_348,this,(Node *)pSVar6);
                local_358 = std::__cxx11::string::data();
                local_350 = std::__cxx11::string::length();
                __first = std::
                          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&__range5);
                __last = std::
                         vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&__range5);
                std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>::allocator
                          ((allocator<std::pair<llvm::StringRef,_llvm::StringRef>_> *)
                           ((long)&values_1.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                std::
                vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                ::
                vector<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::__cxx11::string>*,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>,void>
                          ((vector<std::pair<llvm::StringRef,llvm::StringRef>,std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                            *)&local_380,
                           (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            )__first._M_current,
                           (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            )__last._M_current,
                           (allocator_type *)
                           ((long)&values_1.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                llvm::ArrayRef<std::pair<llvm::StringRef,llvm::StringRef>>::
                ArrayRef<std::allocator<std::pair<llvm::StringRef,llvm::StringRef>>>
                          ((ArrayRef<std::pair<llvm::StringRef,llvm::StringRef>> *)&local_368,
                           &local_380);
                iVar3 = (*pTVar8->_vptr_Tool[4])
                                  (pTVar8,&local_348,local_358,local_350,local_368,local_360);
                std::
                vector<std::pair<llvm::StringRef,_llvm::StringRef>,_std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>_>
                ::~vector(&local_380);
                std::allocator<std::pair<llvm::StringRef,_llvm::StringRef>_>::~allocator
                          ((allocator<std::pair<llvm::StringRef,_llvm::StringRef>_> *)
                           ((long)&values_1.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                cVar10 = (((byte)iVar3 ^ 0xff) & 1) != 0;
                if ((bool)cVar10) {
                  this_local._7_1_ = 0;
                }
                std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&__range5);
joined_r0x002c2ee2:
                if (!(bool)cVar10) {
LAB_002c30e8:
                  cVar10 = '\0';
                }
              }
              else {
                uVar2 = llvm::yaml::Node::getType((Node *)this_01);
                if (uVar2 == 5) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__range6);
                  __end6 = llvm::yaml::SequenceNode::begin(this_01);
                  node = (Node *)llvm::yaml::SequenceNode::end(this_01);
                  while (bVar1 = llvm::yaml::
                                 basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                 ::operator!=(&__end6,(
                                                  basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                                  *)&node), bVar1) {
                    local_3d0 = (ScalarNode *)
                                llvm::yaml::
                                basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                ::operator*(&__end6);
                    uVar2 = llvm::yaml::Node::getType((Node *)local_3d0);
                    pSVar9 = local_3d0;
                    if (uVar2 == 1) {
                      (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                                (&local_400,this,local_3d0);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&__range6,&local_400);
                      std::__cxx11::string::~string((string *)&local_400);
                    }
                    else {
                      strlen("invalid value type for tool in \'tools\' map");
                      error(this,&pSVar9->super_Node,local_3e0);
                    }
                    llvm::yaml::
                    basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
                    operator++(&__end6);
                  }
                  getContext(&local_428,this,(Node *)pSVar6);
                  local_438 = std::__cxx11::string::data();
                  local_430 = std::__cxx11::string::length();
                  local_468._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&__range6);
                  local_470._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&__range6);
                  std::allocator<llvm::StringRef>::allocator(&local_471);
                  std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>::
                  vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                            ((vector<llvm::StringRef,std::allocator<llvm::StringRef>> *)&local_460,
                             local_468,local_470,&local_471);
                  llvm::ArrayRef<llvm::StringRef>::ArrayRef<std::allocator<llvm::StringRef>>
                            (&local_448,&local_460);
                  iVar3 = (*pTVar8->_vptr_Tool[3])
                                    (pTVar8,&local_428,local_438,local_430,local_448.Data,
                                     local_448.Length);
                  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector
                            (&local_460);
                  std::allocator<llvm::StringRef>::~allocator(&local_471);
                  cVar10 = (((byte)iVar3 ^ 0xff) & 1) != 0;
                  if ((bool)cVar10) {
                    this_local._7_1_ = 0;
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&__range6);
                  goto joined_r0x002c2ee2;
                }
                uVar2 = llvm::yaml::Node::getType((Node *)this_01);
                if (uVar2 == 1) {
                  getContext(&local_4b0,this,(Node *)pSVar6);
                  local_4c0 = std::__cxx11::string::data();
                  local_4b8 = std::__cxx11::string::length();
                  (anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
                            (&local_4f0,this,(ScalarNode *)this_01);
                  local_4d0 = std::__cxx11::string::data();
                  uVar7 = std::__cxx11::string::length();
                  iVar3 = (*pTVar8->_vptr_Tool[2])
                                    (pTVar8,&local_4b0,local_4c0,local_4b8,local_4d0,uVar7);
                  std::__cxx11::string::~string((string *)&local_4f0);
                  if ((((byte)iVar3 ^ 0xff) & 1) != 0) {
                    this_local._7_1_ = 0;
                    cVar10 = '\x01';
                    goto LAB_002c30f2;
                  }
                  goto LAB_002c30e8;
                }
                strlen("invalid value type for tool in \'tools\' map");
                error(this,(Node *)this_01,local_488);
                cVar10 = '\x05';
              }
LAB_002c30f2:
              std::__cxx11::string::~string
                        ((string *)
                         &values.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if ((cVar10 != '\0') && (cVar10 != '\x05')) goto LAB_002c313a;
            }
            else {
              strlen("invalid key type for tool in \'tools\' map");
              error(this,(Node *)pSVar6,stack0xfffffffffffffe58);
            }
            llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
            ::operator++(&__end3);
          }
          cVar10 = '\0';
        }
LAB_002c313a:
        std::__cxx11::string::~string((string *)&attrs);
        if (cVar10 != '\0') goto LAB_002c316e;
      }
      else {
        pNVar5 = llvm::yaml::KeyValueNode::getValue(pKVar4);
        strlen("invalid value type in \'tools\' map");
        error(this,pNVar5,stack0xfffffffffffffee0);
      }
    }
    else {
      pNVar5 = llvm::yaml::KeyValueNode::getKey(pKVar4);
      strlen("invalid key type in \'tools\' map");
      error(this,pNVar5,local_110);
    }
    llvm::yaml::basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::
    operator++(&__end2);
  }
  this_local._7_1_ = 1;
LAB_002c316e:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool parseToolsMapping(llvm::yaml::MappingNode* map) {
    for (auto& entry: *map) {
      // Every key must be scalar.
      if (entry.getKey()->getType() != llvm::yaml::Node::NK_Scalar) {
        error(entry.getKey(), "invalid key type in 'tools' map");
        continue;
      }
      // Every value must be a mapping.
      if (entry.getValue()->getType() != llvm::yaml::Node::NK_Mapping) {
        error(entry.getValue(), "invalid value type in 'tools' map");
        continue;
      }

      std::string name = stringFromScalarNode(
          static_cast<llvm::yaml::ScalarNode*>(entry.getKey()));
      llvm::yaml::MappingNode* attrs = static_cast<llvm::yaml::MappingNode*>(
          entry.getValue());

      // Get the tool.
      auto tool = getOrCreateTool(name, entry.getKey());
      if (!tool) {
        return false;
      }

      // Configure all of the tool attributes.
      for (auto& valueEntry: *attrs) {
        auto key = valueEntry.getKey();
        auto value = valueEntry.getValue();
        
        // All keys must be scalar.
        if (key->getType() != llvm::yaml::Node::NK_Scalar) {
          error(key, "invalid key type for tool in 'tools' map");
          continue;
        }


        auto attribute = stringFromScalarNode(
            static_cast<llvm::yaml::ScalarNode*>(key));

        if (value->getType() == llvm::yaml::Node::NK_Mapping) {
          std::vector<std::pair<std::string, std::string>> values;
          for (auto& entry: *static_cast<llvm::yaml::MappingNode*>(value)) {
            // Every key must be scalar.
            if (entry.getKey()->getType() != llvm::yaml::Node::NK_Scalar) {
              error(entry.getKey(), ("invalid key type for '" + attribute +
                                     "' in 'tools' map"));
              continue;
            }
            // Every value must be scalar.
            if (entry.getValue()->getType() != llvm::yaml::Node::NK_Scalar) {
              error(entry.getKey(), ("invalid value type for '" + attribute +
                                     "' in 'tools' map"));
              continue;
            }

            std::string key = stringFromScalarNode(
                static_cast<llvm::yaml::ScalarNode*>(entry.getKey()));
            std::string value = stringFromScalarNode(
                static_cast<llvm::yaml::ScalarNode*>(entry.getValue()));
            values.push_back(std::make_pair(key, value));
          }

          if (!tool->configureAttribute(
                  getContext(key), attribute,
                  std::vector<std::pair<StringRef, StringRef>>(
                      values.begin(), values.end()))) {
            return false;
          }
        } else if (value->getType() == llvm::yaml::Node::NK_Sequence) {
          std::vector<std::string> values;
          for (auto& node: *static_cast<llvm::yaml::SequenceNode*>(value)) {
            if (node.getType() != llvm::yaml::Node::NK_Scalar) {
              error(&node, "invalid value type for tool in 'tools' map");
              continue;
            }
            values.push_back(
                stringFromScalarNode(
                    static_cast<llvm::yaml::ScalarNode*>(&node)));
          }

          if (!tool->configureAttribute(
                  getContext(key), attribute,
                  std::vector<StringRef>(values.begin(), values.end()))) {
            return false;
          }
        } else {
          if (value->getType() != llvm::yaml::Node::NK_Scalar) {
            error(value, "invalid value type for tool in 'tools' map");
            continue;
          }

          if (!tool->configureAttribute(
                  getContext(key), attribute,
                  stringFromScalarNode(
                      static_cast<llvm::yaml::ScalarNode*>(value)))) {
            return false;
          }
        }
      }
    }

    return true;
  }